

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * __thiscall
duckdb::Value::CreateValue<char_const*>(Value *__return_storage_ptr__,Value *this,char *value)

{
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(char *)this,&local_31);
  Value(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::CreateValue(const char *value) {
	return Value(string(value));
}